

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void duckdb::vector<unsigned_char_*,_true>::AssertIndexInBounds(idx_t index,idx_t size)

{
  InternalException *this;
  allocator local_41;
  string local_40;
  
  if (index < size) {
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Attempted to access index %ld within vector of size %ld",&local_41
            );
  InternalException::InternalException<unsigned_long,unsigned_long>(this,&local_40,index,size);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline void AssertIndexInBounds(idx_t index, idx_t size) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(index >= size)) {
			throw InternalException("Attempted to access index %ld within vector of size %ld", index, size);
		}
#endif
	}